

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

bool __thiscall imrt::Station::canIncreaseIntensity(Station *this,int beam)

{
  double *pdVar1;
  bool bVar2;
  long lVar3;
  
  if (this->max_apertures < 1) {
    return false;
  }
  lVar3 = 0;
  while ((bVar2 = isOpenBeamlet(this,beam,(int)lVar3), !bVar2 ||
         (pdVar1 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar3,
         (double)this->max_intensity < *pdVar1 || (double)this->max_intensity == *pdVar1))) {
    lVar3 = lVar3 + 1;
    if (this->max_apertures <= lVar3) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Station::canIncreaseIntensity(int beam){
    for (int i =0;i<max_apertures;i++)
      if (isOpenBeamlet(beam,i) && intensity[i]<max_intensity) return(true);
      return(false);
  }